

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_archiver_7z.c
# Opt level: O0

int SZIP_stat(void *opaque,char *path,PHYSFS_Stat *stat)

{
  uint uVar1;
  void *pvVar2;
  PHYSFS_uint64 PVar3;
  PHYSFS_uint32 idx;
  SZIPentry *entry;
  SZIPinfo *info;
  PHYSFS_Stat *stat_local;
  char *path_local;
  void *opaque_local;
  
  pvVar2 = __PHYSFS_DirTreeFind((__PHYSFS_DirTree *)opaque,path);
  if (pvVar2 == (void *)0x0) {
    opaque_local._4_4_ = 0;
  }
  else {
    uVar1 = *(uint *)((long)pvVar2 + 0x28);
    if (*(int *)((long)pvVar2 + 0x20) == 0) {
      stat->filesize =
           *(long *)(*(long *)((long)opaque + 0x90) + (ulong)(uVar1 + 1) * 8) -
           *(long *)(*(long *)((long)opaque + 0x90) + (ulong)uVar1 * 8);
      stat->filetype = PHYSFS_FILETYPE_REGULAR;
    }
    else {
      stat->filesize = -1;
      stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
    }
    if (*(long *)((long)opaque + 200) == 0) {
      if (*(long *)((long)opaque + 0xd8) == 0) {
        stat->modtime = -1;
      }
      else {
        PVar3 = lzmasdkTimeToPhysfsTime
                          ((CNtfsFileTime *)(*(long *)((long)opaque + 0xd8) + (ulong)uVar1 * 8));
        stat->modtime = PVar3;
      }
    }
    else {
      PVar3 = lzmasdkTimeToPhysfsTime
                        ((CNtfsFileTime *)(*(long *)((long)opaque + 200) + (ulong)uVar1 * 8));
      stat->modtime = PVar3;
    }
    if (*(long *)((long)opaque + 0xd8) == 0) {
      if (*(long *)((long)opaque + 200) == 0) {
        stat->createtime = -1;
      }
      else {
        PVar3 = lzmasdkTimeToPhysfsTime
                          ((CNtfsFileTime *)(*(long *)((long)opaque + 200) + (ulong)uVar1 * 8));
        stat->createtime = PVar3;
      }
    }
    else {
      PVar3 = lzmasdkTimeToPhysfsTime
                        ((CNtfsFileTime *)(*(long *)((long)opaque + 0xd8) + (ulong)uVar1 * 8));
      stat->createtime = PVar3;
    }
    stat->accesstime = -1;
    stat->readonly = 1;
    opaque_local._4_4_ = 1;
  }
  return opaque_local._4_4_;
}

Assistant:

static int SZIP_stat(void *opaque, const char *path, PHYSFS_Stat *stat)
{
    SZIPinfo *info = (SZIPinfo *) opaque;
    SZIPentry *entry;
    PHYSFS_uint32 idx;

    entry = (SZIPentry *) __PHYSFS_DirTreeFind(&info->tree, path);
    BAIL_IF_ERRPASS(!entry, 0);
    idx = entry->dbidx;

    if (entry->tree.isdir)
    {
        stat->filesize = -1;
	    stat->filetype = PHYSFS_FILETYPE_DIRECTORY;
    } /* if */
    else
    {
        stat->filesize = (PHYSFS_sint64) SzArEx_GetFileSize(&info->db, idx);
	    stat->filetype = PHYSFS_FILETYPE_REGULAR;
    } /* else */

    if (info->db.MTime.Vals != NULL)
	    stat->modtime = lzmasdkTimeToPhysfsTime(&info->db.MTime.Vals[idx]);
    else if (info->db.CTime.Vals != NULL)
	    stat->modtime = lzmasdkTimeToPhysfsTime(&info->db.CTime.Vals[idx]);
    else
	    stat->modtime = -1;

    if (info->db.CTime.Vals != NULL)
	    stat->createtime = lzmasdkTimeToPhysfsTime(&info->db.CTime.Vals[idx]);
    else if (info->db.MTime.Vals != NULL)
	    stat->createtime = lzmasdkTimeToPhysfsTime(&info->db.MTime.Vals[idx]);
    else
	    stat->createtime = -1;

	stat->accesstime = -1;
	stat->readonly = 1;

    return 1;
}